

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

bool __thiscall BinGE<1,_0,_0>::propagate(BinGE<1,_0,_0> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  IntVar *pIVar5;
  long lVar6;
  bool bVar7;
  IntVar *pIVar8;
  long lVar9;
  TrailElem local_30;
  
  pIVar5 = (this->x).var;
  pIVar8 = (this->y).var;
  iVar4 = (pIVar5->min).v;
  iVar3 = (pIVar8->min).v;
  iVar2 = (pIVar5->max).v;
  iVar1 = -iVar2;
  if (iVar3 == iVar1 || SBORROW4(iVar3,iVar1) != iVar3 + iVar2 < 0) {
LAB_001b396d:
    lVar9 = -(long)iVar4;
    iVar4 = (pIVar8->max).v;
    if ((int)lVar9 < iVar4) {
      if (so.lazy == true) {
        iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
        lVar6 = (long)iVar4 * 4 + 2;
        pIVar8 = (this->y).var;
      }
      else {
        lVar6 = 0;
      }
      iVar4 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[0xf])(pIVar8,lVar9,lVar6,1);
      if ((char)iVar4 == '\0') goto LAB_001b39fb;
      iVar4 = (((this->y).var)->max).v;
    }
    iVar3 = (((this->x).var)->max).v;
    iVar2 = -iVar3;
    bVar7 = true;
    if (iVar4 == iVar2 || SBORROW4(iVar4,iVar2) != iVar4 + iVar3 < 0) {
      local_30.pt = (int *)&(this->super_Propagator).satisfied;
      local_30.x = (int)(this->super_Propagator).satisfied.v;
      local_30.sz = 1;
      vec<TrailElem>::push(&engine.trail,&local_30);
      (this->super_Propagator).satisfied.v = '\x01';
    }
  }
  else {
    if (so.lazy) {
      iVar2 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[8])();
      lVar9 = (long)iVar2 * 4 + 2;
      pIVar5 = (this->x).var;
    }
    else {
      lVar9 = 0;
    }
    iVar3 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0xf])(pIVar5,-(long)iVar3,lVar9,1)
    ;
    if ((char)iVar3 != '\0') {
      pIVar8 = (this->y).var;
      goto LAB_001b396d;
    }
LAB_001b39fb:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();

		// Can finesse!!
		if ((R != 0) && x_max < y_min) {
			setDom(r, setVal, 0, x.getMaxLit(), y.getMinLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		// Finesses x's lower bound
		if (R != 0) {
			setDom(x, setMin, y_min, y.getMinLit(), r.getValLit());
		} else {
			setDom(x, setMin, y_min, y.getMinLit());
		}
		if (R != 0) {
			setDom(y, setMax, x_max, x.getMaxLit(), r.getValLit());
		} else {
			setDom(y, setMax, x_max, x.getMaxLit());
		}

		if (x.getMin() >= y.getMax()) {
			satisfied = true;
		}

		return true;
	}